

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O0

void __thiscall OjaNewton::compute_delta(OjaNewton *this)

{
  long in_RDI;
  double dVar1;
  float gamma;
  int i;
  undefined4 local_c;
  
  *(undefined4 *)(in_RDI + 0xa0) = 0;
  for (local_c = 1; local_c <= *(int *)(in_RDI + 8); local_c = local_c + 1) {
    dVar1 = std::fmin((double)(ulong)(uint)(*(float *)(in_RDI + 0xa8) /
                                           (float)*(int *)(in_RDI + 0x18)),5.26354424712089e-315);
    *(float *)(*(long *)(in_RDI + 0x98) + (long)local_c * 4) =
         SUB84(dVar1,0) * *(float *)(*(long *)(in_RDI + 0x88) + (long)local_c * 4) *
         *(float *)(in_RDI + 0x7c);
    *(float *)(in_RDI + 0xa0) =
         *(float *)(*(long *)(in_RDI + 0x98) + (long)local_c * 4) *
         *(float *)(*(long *)(in_RDI + 0x28) + (long)local_c * 4) + *(float *)(in_RDI + 0xa0);
  }
  return;
}

Assistant:

void compute_delta()
  {
    data.bdelta = 0;
    for (int i = 1; i <= m; i++)
    {
      float gamma = fmin(learning_rate_cnt / t, 1.f);

      // if different learning rates are used
      /*data.delta[i] = gamma * data.AZx[i] * data.sketch_cnt;
      for (int j = 1; j < i; j++) {
          data.delta[i] -= A[i][j] * data.delta[j];
      }
      data.delta[i] /= A[i][i];*/

      // if a same learning rate is used
      data.delta[i] = gamma * data.Zx[i] * data.sketch_cnt;

      data.bdelta += data.delta[i] * b[i];
    }
  }